

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O1

unique_ptr<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>_> __thiscall
groundupdbext::EmbeddedDatabase::Impl::createEmpty(Impl *this,string *dbname)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider _Var2;
  char cVar3;
  long *plVar4;
  size_type *psVar5;
  string dbfolder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string basedir;
  path local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,".groundupdb","");
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_90,&local_48,auto_format);
  cVar3 = std::filesystem::status(&local_90);
  std::filesystem::__cxx11::path::~path(&local_90);
  if ((cVar3 == -1) || (cVar3 == '\0')) {
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_90,&local_48,auto_format);
    std::filesystem::create_directory(&local_90);
    std::filesystem::__cxx11::path::~path(&local_90);
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,local_48._M_dataplus._M_p,
             local_48._M_dataplus._M_p + local_48._M_string_length);
  std::__cxx11::string::append((char *)&local_68);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_68,(ulong)(dbname->_M_dataplus)._M_p);
  paVar1 = &local_90._M_pathname.field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_90._M_pathname.field_2._M_allocated_capacity = *psVar5;
    local_90._M_pathname.field_2._8_8_ = plVar4[3];
    local_90._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_90._M_pathname.field_2._M_allocated_capacity = *psVar5;
    local_90._M_pathname._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_90._M_pathname._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  std::
  make_unique<groundupdbext::EmbeddedDatabase::Impl,std::__cxx11::string&,std::__cxx11::string&>
            (&local_68,dbname);
  _Var2._M_p = local_68._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)0x0;
  (this->super_IDatabase)._vptr_IDatabase = (_func_int **)_Var2._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_pathname._M_dataplus._M_p,
                    local_90._M_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return (__uniq_ptr_data<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>,_true,_true>
          )(__uniq_ptr_data<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>,_true,_true>
            )this;
}

Assistant:

const std::unique_ptr<IDatabase> EmbeddedDatabase::Impl::createEmpty(std::string dbname) {
  std::string basedir(".groundupdb");
  if (!fs::exists(basedir)) {
      fs::create_directory(basedir);
  }
  std::string dbfolder(basedir + "/" + dbname);
  return std::make_unique<EmbeddedDatabase::Impl>(dbname,dbfolder);
}